

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::LineExitDiamondGenerator::rasterize
          (LineExitDiamondGenerator *this,LineExitDiamond *lineDiamonds,int maxDiamonds,
          int *numWritten)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  SubpixelLineSegment line;
  Vector<long,_2> diamondPosition;
  Vector<long,_2> local_a8;
  Vector<long,_2> local_98;
  Vector<long,_2> local_88;
  SubpixelLineSegment local_78;
  Vector<long,_2> local_58;
  Vector<long,_2> local_40;
  
  local_78.m_v0.m_data[1] = 0x100000000;
  local_78.m_v0.m_data[0] = (long)this;
  tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)&local_78);
  fVar7 = (float)((ulong)local_88.m_data[0] >> 0x20);
  uVar4 = -(uint)((float)local_88.m_data[0] < 0.0);
  uVar5 = -(uint)(fVar7 < 0.0);
  local_58.m_data[0] =
       (long)((float)local_88.m_data[0] * 256.0 + (float)(~uVar4 & 0x3f000000 | uVar4 & 0xbf000000))
  ;
  local_58.m_data[1] = (long)(fVar7 * 256.0 + (float)(~uVar5 & 0x3f000000 | uVar5 & 0xbf000000));
  local_78.m_v0.m_data[0] = (long)&this->m_v1;
  local_78.m_v0.m_data[1] = 0x100000000;
  tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)&local_78);
  fVar7 = (float)((ulong)local_40.m_data[0] >> 0x20);
  uVar4 = -(uint)((float)local_40.m_data[0] < 0.0);
  uVar5 = -(uint)(fVar7 < 0.0);
  local_88.m_data[0] =
       (long)((float)local_40.m_data[0] * 256.0 + (float)(~uVar4 & 0x3f000000 | uVar4 & 0xbf000000))
  ;
  local_88.m_data[1] = (long)(fVar7 * 256.0 + (float)(~uVar5 & 0x3f000000 | uVar5 & 0xbf000000));
  LineRasterUtil::SubpixelLineSegment::SubpixelLineSegment(&local_78,&local_58,&local_88);
  iVar3 = 0;
  while ((iVar8 = (this->m_curPos).m_data[1], iVar8 <= (this->m_bboxMax).m_data[1] &&
         (iVar3 < maxDiamonds))) {
    iVar6 = (this->m_curPos).m_data[0] << 8;
    iVar8 = iVar8 << 8;
    local_98.m_data[0] = CONCAT44(-(uint)(iVar6 < 0),iVar6);
    local_88.m_data[0] = CONCAT44(-(uint)(iVar8 < 0),iVar8);
    local_a8.m_data[0] = 0x80;
    local_a8.m_data[1] = 0x80;
    tcu::operator+(&local_98,&local_a8);
    bVar2 = LineRasterUtil::doesLineSegmentExitDiamond(&local_78,&local_40);
    if (bVar2) {
      *(undefined8 *)lineDiamonds[iVar3].position.m_data = *(undefined8 *)(this->m_curPos).m_data;
      iVar3 = iVar3 + 1;
    }
    iVar8 = (this->m_curPos).m_data[0] + 1;
    (this->m_curPos).m_data[0] = iVar8;
    if ((this->m_bboxMax).m_data[0] < iVar8) {
      piVar1 = (this->m_curPos).m_data + 1;
      *piVar1 = *piVar1 + 1;
      (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
    }
  }
  *numWritten = iVar3;
  return;
}

Assistant:

void LineExitDiamondGenerator::rasterize (LineExitDiamond* const lineDiamonds, const int maxDiamonds, int& numWritten)
{
	DE_ASSERT(maxDiamonds > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy());
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy());
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											diamondNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && diamondNdx < maxDiamonds)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			LineExitDiamond& packet = lineDiamonds[diamondNdx];
			packet.position = m_curPos;
			++diamondNdx;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(diamondNdx <= maxDiamonds);
	numWritten = diamondNdx;
}